

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value-pprint.cc
# Opt level: O0

ostream * std::operator<<(ostream *ofs,matrix4d *m)

{
  ostream *poVar1;
  char *pcVar2;
  _anonymous_namespace_ *p_Var3;
  string local_218;
  string local_1f8;
  string local_1d8;
  string local_1b8;
  string local_198;
  string local_178;
  string local_158;
  string local_138;
  string local_118;
  string local_f8;
  string local_d8;
  string local_b8;
  string local_98;
  string local_78;
  string local_58;
  string local_38;
  matrix4d *local_18;
  matrix4d *m_local;
  ostream *ofs_local;
  
  local_18 = m;
  m_local = (matrix4d *)ofs;
  std::operator<<(ofs,"( ");
  pcVar2 = "(";
  poVar1 = std::operator<<((ostream *)m_local,"(");
  tinyusdz::(anonymous_namespace)::dtos_abi_cxx11_
            (&local_38,(_anonymous_namespace_ *)pcVar2,local_18->m[0][0]);
  poVar1 = std::operator<<(poVar1,(string *)&local_38);
  p_Var3 = (_anonymous_namespace_ *)0x59dfed;
  poVar1 = std::operator<<(poVar1,", ");
  tinyusdz::(anonymous_namespace)::dtos_abi_cxx11_(&local_58,p_Var3,local_18->m[0][1]);
  poVar1 = std::operator<<(poVar1,(string *)&local_58);
  p_Var3 = (_anonymous_namespace_ *)0x59dfed;
  poVar1 = std::operator<<(poVar1,", ");
  tinyusdz::(anonymous_namespace)::dtos_abi_cxx11_(&local_78,p_Var3,local_18->m[0][2]);
  poVar1 = std::operator<<(poVar1,(string *)&local_78);
  p_Var3 = (_anonymous_namespace_ *)0x59dfed;
  poVar1 = std::operator<<(poVar1,", ");
  tinyusdz::(anonymous_namespace)::dtos_abi_cxx11_(&local_98,p_Var3,local_18->m[0][3]);
  poVar1 = std::operator<<(poVar1,(string *)&local_98);
  std::operator<<(poVar1,"), ");
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_38);
  pcVar2 = "(";
  poVar1 = std::operator<<((ostream *)m_local,"(");
  tinyusdz::(anonymous_namespace)::dtos_abi_cxx11_
            (&local_b8,(_anonymous_namespace_ *)pcVar2,local_18->m[1][0]);
  poVar1 = std::operator<<(poVar1,(string *)&local_b8);
  p_Var3 = (_anonymous_namespace_ *)0x59dfed;
  poVar1 = std::operator<<(poVar1,", ");
  tinyusdz::(anonymous_namespace)::dtos_abi_cxx11_(&local_d8,p_Var3,local_18->m[1][1]);
  poVar1 = std::operator<<(poVar1,(string *)&local_d8);
  p_Var3 = (_anonymous_namespace_ *)0x59dfed;
  poVar1 = std::operator<<(poVar1,", ");
  tinyusdz::(anonymous_namespace)::dtos_abi_cxx11_(&local_f8,p_Var3,local_18->m[1][2]);
  poVar1 = std::operator<<(poVar1,(string *)&local_f8);
  p_Var3 = (_anonymous_namespace_ *)0x59dfed;
  poVar1 = std::operator<<(poVar1,", ");
  tinyusdz::(anonymous_namespace)::dtos_abi_cxx11_(&local_118,p_Var3,local_18->m[1][3]);
  poVar1 = std::operator<<(poVar1,(string *)&local_118);
  std::operator<<(poVar1,"), ");
  std::__cxx11::string::~string((string *)&local_118);
  std::__cxx11::string::~string((string *)&local_f8);
  std::__cxx11::string::~string((string *)&local_d8);
  std::__cxx11::string::~string((string *)&local_b8);
  pcVar2 = "(";
  poVar1 = std::operator<<((ostream *)m_local,"(");
  tinyusdz::(anonymous_namespace)::dtos_abi_cxx11_
            (&local_138,(_anonymous_namespace_ *)pcVar2,local_18->m[2][0]);
  poVar1 = std::operator<<(poVar1,(string *)&local_138);
  p_Var3 = (_anonymous_namespace_ *)0x59dfed;
  poVar1 = std::operator<<(poVar1,", ");
  tinyusdz::(anonymous_namespace)::dtos_abi_cxx11_(&local_158,p_Var3,local_18->m[2][1]);
  poVar1 = std::operator<<(poVar1,(string *)&local_158);
  p_Var3 = (_anonymous_namespace_ *)0x59dfed;
  poVar1 = std::operator<<(poVar1,", ");
  tinyusdz::(anonymous_namespace)::dtos_abi_cxx11_(&local_178,p_Var3,local_18->m[2][2]);
  poVar1 = std::operator<<(poVar1,(string *)&local_178);
  p_Var3 = (_anonymous_namespace_ *)0x59dfed;
  poVar1 = std::operator<<(poVar1,", ");
  tinyusdz::(anonymous_namespace)::dtos_abi_cxx11_(&local_198,p_Var3,local_18->m[2][3]);
  poVar1 = std::operator<<(poVar1,(string *)&local_198);
  std::operator<<(poVar1,"), ");
  std::__cxx11::string::~string((string *)&local_198);
  std::__cxx11::string::~string((string *)&local_178);
  std::__cxx11::string::~string((string *)&local_158);
  std::__cxx11::string::~string((string *)&local_138);
  pcVar2 = "(";
  poVar1 = std::operator<<((ostream *)m_local,"(");
  tinyusdz::(anonymous_namespace)::dtos_abi_cxx11_
            (&local_1b8,(_anonymous_namespace_ *)pcVar2,local_18->m[3][0]);
  poVar1 = std::operator<<(poVar1,(string *)&local_1b8);
  p_Var3 = (_anonymous_namespace_ *)0x59dfed;
  poVar1 = std::operator<<(poVar1,", ");
  tinyusdz::(anonymous_namespace)::dtos_abi_cxx11_(&local_1d8,p_Var3,local_18->m[3][1]);
  poVar1 = std::operator<<(poVar1,(string *)&local_1d8);
  p_Var3 = (_anonymous_namespace_ *)0x59dfed;
  poVar1 = std::operator<<(poVar1,", ");
  tinyusdz::(anonymous_namespace)::dtos_abi_cxx11_(&local_1f8,p_Var3,local_18->m[3][2]);
  poVar1 = std::operator<<(poVar1,(string *)&local_1f8);
  p_Var3 = (_anonymous_namespace_ *)0x59dfed;
  poVar1 = std::operator<<(poVar1,", ");
  tinyusdz::(anonymous_namespace)::dtos_abi_cxx11_(&local_218,p_Var3,local_18->m[3][3]);
  poVar1 = std::operator<<(poVar1,(string *)&local_218);
  std::operator<<(poVar1,")");
  std::__cxx11::string::~string((string *)&local_218);
  std::__cxx11::string::~string((string *)&local_1f8);
  std::__cxx11::string::~string((string *)&local_1d8);
  std::__cxx11::string::~string((string *)&local_1b8);
  std::operator<<((ostream *)m_local," )");
  return (ostream *)m_local;
}

Assistant:

std::ostream &operator<<(std::ostream &ofs,
                         const tinyusdz::value::matrix4d &m) {
  ofs << "( ";

  ofs << "(" << tinyusdz::dtos(m.m[0][0]) << ", " << tinyusdz::dtos(m.m[0][1])
      << ", " << tinyusdz::dtos(m.m[0][2]) << ", " << tinyusdz::dtos(m.m[0][3])
      << "), ";
  ofs << "(" << tinyusdz::dtos(m.m[1][0]) << ", " << tinyusdz::dtos(m.m[1][1])
      << ", " << tinyusdz::dtos(m.m[1][2]) << ", " << tinyusdz::dtos(m.m[1][3])
      << "), ";
  ofs << "(" << tinyusdz::dtos(m.m[2][0]) << ", " << tinyusdz::dtos(m.m[2][1])
      << ", " << tinyusdz::dtos(m.m[2][2]) << ", " << tinyusdz::dtos(m.m[2][3])
      << "), ";
  ofs << "(" << tinyusdz::dtos(m.m[3][0]) << ", " << tinyusdz::dtos(m.m[3][1])
      << ", " << tinyusdz::dtos(m.m[3][2]) << ", " << tinyusdz::dtos(m.m[3][3])
      << ")";

  ofs << " )";

  return ofs;
}